

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O0

unique_ptr<interfaces::Handler,_std::default_delete<interfaces::Handler>_> __thiscall
wallet::anon_unknown_5::WalletLoaderImpl::handleLoadWallet(WalletLoaderImpl *this,LoadWalletFn *fn)

{
  long lVar1;
  function<void_(std::unique_ptr<interfaces::Wallet,_std::default_delete<interfaces::Wallet>_>)>
  *in_RDX;
  WalletContext *in_RSI;
  __uniq_ptr_data<interfaces::Handler,_std::default_delete<interfaces::Handler>,_true,_true> in_RDI;
  long in_FS_OFFSET;
  function<void_(std::unique_ptr<interfaces::Wallet,_std::default_delete<interfaces::Wallet>_>)>
  *in_stack_ffffffffffffff78;
  function<void_(std::unique_ptr<interfaces::Wallet,_std::default_delete<interfaces::Wallet>_>)>
  *in_stack_ffffffffffffff80;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::
  function<void_(std::unique_ptr<interfaces::Wallet,_std::default_delete<interfaces::Wallet>_>)>::
  function(in_RDX,in_stack_ffffffffffffff80);
  HandleLoadWallet(in_RSI,in_RDX);
  std::
  function<void_(std::unique_ptr<interfaces::Wallet,_std::default_delete<interfaces::Wallet>_>)>::
  ~function(in_stack_ffffffffffffff78);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (__uniq_ptr_data<interfaces::Handler,_std::default_delete<interfaces::Handler>,_true,_true>
            )(tuple<interfaces::Handler_*,_std::default_delete<interfaces::Handler>_>)
             in_RDI.
             super___uniq_ptr_impl<interfaces::Handler,_std::default_delete<interfaces::Handler>_>.
             _M_t.
             super__Tuple_impl<0UL,_interfaces::Handler_*,_std::default_delete<interfaces::Handler>_>
             .super__Head_base<0UL,_interfaces::Handler_*,_false>._M_head_impl;
  }
  __stack_chk_fail();
}

Assistant:

std::unique_ptr<Handler> handleLoadWallet(LoadWalletFn fn) override
    {
        return HandleLoadWallet(m_context, std::move(fn));
    }